

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall picojson::default_parse_context::parse_array_start(default_parse_context *this)

{
  value *pvVar1;
  array *paVar2;
  value local_18;
  
  paVar2 = (array *)operator_new(0x18);
  (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = this->out_;
  local_18.type_ = pvVar1->type_;
  pvVar1->type_ = 4;
  local_18.u_ = pvVar1->u_;
  (pvVar1->u_).array_ = paVar2;
  value::clear(&local_18);
  return true;
}

Assistant:

bool parse_array_start() {
    *out_ = value(array_type, false);
    return true;
  }